

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseMacroParameters(MipsParser *this,Parser *parser,MipsMacroDefinition *macro)

{
  char symbol;
  anon_struct_40_4_e71670ea_for_secondary *paVar1;
  bool bVar2;
  Token *pTVar3;
  MipsParser *dest;
  MipsParser *this_00;
  char *pcVar4;
  
  pcVar4 = macro->args;
  this_00 = this;
  do {
    symbol = *pcVar4;
    if (symbol == '\0') {
      pTVar3 = Parser::peekToken(parser,0);
      if (pTVar3->type == LParen) {
        return false;
      }
      pTVar3 = Parser::nextToken(parser);
      return pTVar3->type == Separator;
    }
    pcVar4 = pcVar4 + 1;
    paVar1 = &(this->immediate).secondary;
    if (symbol == 'I') {
LAB_0015b6d6:
      bVar2 = parseImmediate(this_00,parser,&paVar1->expression);
    }
    else if (symbol == 'S') {
      bVar2 = parseFpuRegister(this_00,parser,&(this->registers).frs);
    }
    else {
      dest = (MipsParser *)&(this->registers).grd;
      if (symbol != 'd') {
        paVar1 = (anon_struct_40_4_e71670ea_for_secondary *)&(this->immediate).primary;
        if (symbol == 'i') goto LAB_0015b6d6;
        dest = this;
        if ((symbol != 's') && (dest = (MipsParser *)&(this->registers).grt, symbol != 't')) {
          bVar2 = matchSymbol(this_00,parser,symbol);
          goto LAB_0015b6db;
        }
      }
      bVar2 = parseRegister(this_00,parser,(MipsRegisterValue *)dest);
    }
LAB_0015b6db:
    if (bVar2 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool MipsParser::parseMacroParameters(Parser& parser, const MipsMacroDefinition& macro)
{
	const char* encoding = macro.args;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'S':	// register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			break;
		case 'I':	// secondary immediate
			CHECK(parseImmediate(parser,immediate.secondary.expression));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	// lw rx,imm is a prefix of lw rx,imm(ry)
	if (parser.peekToken().type == TokenType::LParen)
		return false;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}